

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_File.cpp
# Opt level: O1

uint64_t axl::io::copyFile(File *srcFile,File *dstFile,uint64_t size)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  int iVar3;
  void *src;
  void *dst;
  uint64_t offset;
  ulong size_00;
  Mapping dstMapping;
  Mapping srcMapping;
  Mapping local_58;
  Mapping local_48;
  
  if ((g::getModule()::module == '\0') &&
     (iVar3 = __cxa_guard_acquire(&g::getModule()::module), iVar3 != 0)) {
    g::Module::Module((Module *)g::getModule()::module);
    __cxa_atexit(g::Module::~Module,g::getModule()::module,&__dso_handle);
    __cxa_guard_release(&g::getModule()::module);
  }
  uVar2 = g::getModule()::module._16_8_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = g::getModule()::module._16_8_;
  if (size == 0xffffffffffffffff) {
    size = psx::File::getSize(&srcFile->m_file);
  }
  iVar3 = ftruncate64((dstFile->m_file).
                      super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,size);
  if (iVar3 == -1) {
    err::setLastSystemError();
    offset = 0xffffffffffffffff;
  }
  else {
    size_00 = (uVar2 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar1,0)) + 0x10000;
    local_48.m_p = (void *)0x0;
    local_48.m_size = 0;
    local_58.m_p = (void *)0x0;
    local_58.m_size = 0;
    offset = 0;
    for (; size != 0; size = size - size_00) {
      if (size <= size_00) {
        size_00 = size;
      }
      src = psx::Mapping::map(&local_48,(void *)0x0,size_00,1,1,
                              (srcFile->m_file).
                              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                              m_h,offset);
      dst = psx::Mapping::map(&local_58,(void *)0x0,size_00,3,1,
                              (dstFile->m_file).
                              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                              m_h,offset);
      if (dst == (void *)0x0 || src == (void *)0x0) {
        offset = 0xffffffffffffffff;
        goto LAB_0014dd3f;
      }
      __wrap_memcpy(dst,src,size_00);
      offset = offset + size_00;
    }
    psx::Mapping::unmap(&local_48,local_48.m_size);
    psx::Mapping::unmap(&local_58,local_58.m_size);
LAB_0014dd3f:
    psx::Mapping::~Mapping(&local_58);
    psx::Mapping::~Mapping(&local_48);
  }
  return offset;
}

Assistant:

uint64_t
copyFile(
	const io::File* srcFile,
	io::File* dstFile,
	uint64_t size
) {
	enum {
		BaseBlockSize = 64 * 1024, // 64K
	};

	bool result;

	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size_t blockSize = BaseBlockSize + systemInfo->m_mappingAlignFactor - BaseBlockSize % systemInfo->m_mappingAlignFactor;

	uint64_t offset = 0;

	if (size == -1)
		size = srcFile->getSize();

	result = dstFile->setSize(size);
	if (!result)
		return -1;

#if (_AXL_OS_WIN)
	win::Mapping srcMapping;
	win::Mapping dstMapping;
	win::MappedView srcView;
	win::MappedView dstView;

	result =
		srcMapping.create(srcFile->m_file, NULL, PAGE_READONLY, size) &&
		dstMapping.create(dstFile->m_file, NULL, PAGE_READWRITE, size);

	if (!result)
		return -1;

	while (size) {
		if (blockSize > size)
			blockSize = (size_t)size;

		const void* src = srcView.view(srcMapping, FILE_MAP_READ, offset, blockSize);
		void* dst = dstView.view(dstMapping, FILE_MAP_READ | FILE_MAP_WRITE, offset, blockSize);

		if (!src || !dst)
			return -1;

		memcpy(dst, src, blockSize);

		offset += blockSize;
		size -= blockSize;
	}

	srcMapping.close();
	dstMapping.close();
	srcView.close();
	dstView.close();
#else
	psx::Mapping srcMapping;
	psx::Mapping dstMapping;

	while (size) {
		if (blockSize > size)
			blockSize = (size_t)size;

		const void* src = srcMapping.map(NULL, blockSize, PROT_READ, MAP_SHARED, srcFile->m_file, offset);
		void* dst = dstMapping.map(NULL, blockSize, PROT_READ | PROT_WRITE, MAP_SHARED, dstFile->m_file, offset);

		if (!src || !dst)
			return -1;

		memcpy(dst, src, blockSize);

		offset += blockSize;
		size -= blockSize;
	}

	srcMapping.close();
	dstMapping.close();
#endif

	return offset;
}